

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_get_function_name(JSContext *ctx,JSAtom name)

{
  BOOL BVar1;
  JSValue JVar2;
  char *unaff_retaddr;
  char *in_stack_00000008;
  JSContext *in_stack_00000010;
  JSValue in_stack_00000018;
  JSValue name_str;
  JSAtom in_stack_ffffffffffffffbc;
  JSContext *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 local_10;
  undefined8 local_8;
  
  JVar2 = JS_AtomToString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  local_10 = JVar2.u;
  local_8 = (JSContext *)JVar2.tag;
  BVar1 = JS_AtomSymbolHasDescription(local_8,JVar2.u._4_4_);
  if (BVar1 != 0) {
    JVar2 = JS_ConcatString3(in_stack_00000010,in_stack_00000008,in_stack_00000018,unaff_retaddr);
    local_10 = JVar2.u;
    local_38 = (JSContext *)JVar2.tag;
    local_8 = local_38;
  }
  JVar2.tag = (int64_t)local_8;
  JVar2.u.float64 = local_10;
  return JVar2;
}

Assistant:

static JSValue js_get_function_name(JSContext *ctx, JSAtom name)
{
    JSValue name_str;

    name_str = JS_AtomToString(ctx, name);
    if (JS_AtomSymbolHasDescription(ctx, name)) {
        name_str = JS_ConcatString3(ctx, "[", name_str, "]");
    }
    return name_str;
}